

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_timer.c
# Opt level: O3

void handle_timeout(cio_timer *timer,void *handler_context,cio_error err)

{
  cio_error cVar1;
  
  if (err == CIO_SUCCESS) {
    fwrite("timer expired!\n",0xf,1,_stdout);
    if (4 < expirations) {
      expirations = expirations + '\x01';
      cio_timer_close(timer);
      cio_eventloop_cancel(&loop);
      return;
    }
    expirations = expirations + '\x01';
    cVar1 = cio_timer_expires_from_now(timer,5000000000,handle_timeout,(void *)0x0);
    if (cVar1 != CIO_SUCCESS) {
      handle_timeout_cold_2();
    }
  }
  else {
    handle_timeout_cold_1();
  }
  return;
}

Assistant:

static void handle_timeout(struct cio_timer *timer, void *handler_context, enum cio_error err)
{
	(void)handler_context;
	if (err == CIO_SUCCESS) {
		(void)fprintf(stdout, "timer expired!\n");
		if (expirations++ < MAX_EXPIRATIONS) {
			if (cio_timer_expires_from_now(timer, FIVE_S, handle_timeout, NULL) != CIO_SUCCESS) {
				(void)fprintf(stderr, "arming timer failed!\n");
			}
		} else {
			cio_timer_close(timer);
			cio_eventloop_cancel(&loop);
		}
	} else {
		(void)fprintf(stderr, "timer error!\n");
	}
}